

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteInvalidModule
          (BinaryWriterSpec *this,ScriptModule *module,string_view text)

{
  ScriptModuleType SVar1;
  string_view __args;
  string_view __args_00;
  int iVar2;
  undefined4 extraout_var;
  TextScriptModule *pTVar3;
  Stream *this_00;
  DataScriptModule<(wabt::ScriptModuleType)1> *pDVar4;
  size_type extraout_RDX;
  char *extension;
  char *s;
  string_view filename_00;
  string_view sVar5;
  string filename;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  string local_50;
  
  SVar1 = module->type_;
  if (SVar1 == Quoted) {
    s = "text";
    extension = kWatExtension;
  }
  else if ((SVar1 == Binary) || (SVar1 == Text)) {
    s = "binary";
    extension = kWasmExtension;
  }
  else {
    s = "";
    extension = "";
  }
  iVar2 = (*module->_vptr_ScriptModule[2])(module);
  WriteLocation(this,(Location *)CONCAT44(extraout_var,iVar2));
  WriteSeparator(this);
  (anonymous_namespace)::BinaryWriterSpec::GetModuleFilename_abi_cxx11_(&local_50,this,extension);
  WriteKey(this,"filename");
  filename_00.size_ = extraout_RDX;
  filename_00.data_ = (char *)local_50._M_string_length;
  sVar5 = GetBasename((wabt *)local_50._M_dataplus._M_p,filename_00);
  WriteEscapedString(this,sVar5);
  WriteSeparator(this);
  WriteKey(this,"text");
  WriteEscapedString(this,text);
  WriteSeparator(this);
  WriteKey(this,"module_type");
  WriteString(this,s);
  __args_00.size_ = local_50._M_string_length;
  __args_00.data_ = local_50._M_dataplus._M_p;
  __args.size_ = local_50._M_string_length;
  __args.data_ = local_50._M_dataplus._M_p;
  sVar5.size_ = local_50._M_string_length;
  sVar5.data_ = local_50._M_dataplus._M_p;
  SVar1 = module->type_;
  if (SVar1 == Quoted) {
    this_00 = std::function<wabt::Stream_*(wabt::string_view)>::operator()
                        (&this->module_stream_factory_,__args_00);
    pDVar4 = (DataScriptModule<(wabt::ScriptModuleType)1> *)
             cast<wabt::DataScriptModule<(wabt::ScriptModuleType)2>,wabt::ScriptModule>(module);
  }
  else {
    if (SVar1 != Binary) {
      if (SVar1 == Text) {
        pTVar3 = cast<wabt::TextScriptModule,wabt::ScriptModule>(module);
        WriteModule(this,sVar5,&pTVar3->module);
      }
      goto LAB_0015fe2e;
    }
    this_00 = std::function<wabt::Stream_*(wabt::string_view)>::operator()
                        (&this->module_stream_factory_,__args);
    pDVar4 = cast<wabt::DataScriptModule<(wabt::ScriptModuleType)1>,wabt::ScriptModule>(module);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,&pDVar4->data);
  Stream::WriteData<unsigned_char>
            (this_00,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,"",No);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_68);
LAB_0015fe2e:
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void BinaryWriterSpec::WriteInvalidModule(const ScriptModule& module,
                                          string_view text) {
  const char* extension = "";
  const char* module_type = "";
  switch (module.type()) {
    case ScriptModuleType::Text:
      extension = kWasmExtension;
      module_type = "binary";
      break;

    case ScriptModuleType::Binary:
      extension = kWasmExtension;
      module_type = "binary";
      break;

    case ScriptModuleType::Quoted:
      extension = kWatExtension;
      module_type = "text";
      break;
  }

  WriteLocation(module.location());
  WriteSeparator();
  std::string filename = GetModuleFilename(extension);
  WriteKey("filename");
  WriteEscapedString(GetBasename(filename));
  WriteSeparator();
  WriteKey("text");
  WriteEscapedString(text);
  WriteSeparator();
  WriteKey("module_type");
  WriteString(module_type);
  WriteScriptModule(filename, module);
}